

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportEnumerator.cpp
# Opt level: O2

void __thiscall axl::spy::ImportIteratorBase::reset(ImportIteratorBase *this)

{
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_30;
  
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&local_30,(C *)0x0);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::move(&this->m_symbolName,&local_30);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_30);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&local_30,(C *)0x0);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::move(&this->m_moduleName,&local_30);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_30);
  this->m_slot = (void **)0x0;
  return;
}

Assistant:

void
ImportIteratorBase::reset() {
	m_symbolName = NULL;
	m_moduleName = NULL;
	m_slot = NULL;
}